

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O0

void __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::~Tokenizer
          (Tokenizer<mecab_node_t,_mecab_path_t> *this)

{
  int in_ESI;
  Tokenizer<mecab_node_t,_mecab_path_t> *in_RDI;
  Dictionary *in_stack_fffffffffffffff0;
  
  in_RDI->_vptr_Tokenizer = (_func_int **)&PTR__Tokenizer_00248428;
  close(in_RDI,in_ESI);
  whatlog::~whatlog((whatlog *)in_RDI);
  CharProperty::~CharProperty((CharProperty *)in_stack_fffffffffffffff0);
  std::
  vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
  ::~vector((vector<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
             *)in_stack_fffffffffffffff0);
  FreeList<mecab_dictionary_info_t>::~FreeList
            ((FreeList<mecab_dictionary_info_t> *)in_stack_fffffffffffffff0);
  scoped_string::~scoped_string((scoped_string *)0x1af82d);
  scoped_string::~scoped_string((scoped_string *)0x1af83e);
  Dictionary::~Dictionary(in_stack_fffffffffffffff0);
  std::vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::~vector
            ((vector<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_> *)
             in_stack_fffffffffffffff0);
  return;
}

Assistant:

virtual ~Tokenizer() { this->close(); }